

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O1

int checkBooleanOption(char *option)

{
  char **ppcVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  
  ppcVar1 = booleanOptionTags;
  lVar5 = 0;
  do {
    iVar2 = strcmp(ppcVar1[lVar5],option + 1);
    iVar4 = 1;
    if (iVar2 == 0) goto LAB_0010191b;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  sVar3 = strlen(option);
  ppcVar1 = booleanOptionTags;
  if (((3 < sVar3) && (option[1] == 'n')) && (option[2] == 'o')) {
    iVar4 = 0;
    lVar5 = 0;
    do {
      iVar2 = strcmp(ppcVar1[lVar5],option + 3);
      if (iVar2 == 0) {
LAB_0010191b:
        booleanOptions[lVar5] = iVar4;
        return 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
  }
  return 0;
}

Assistant:

int checkBooleanOption (char *option)
{
    int o;

    for (o=0;o<MAX_BOOLEAN_OPTIONS;o++)
    {
        if (strcmp (booleanOptionTags[o], &option[1]) == 0)
        {
            booleanOptions[o] = 1;
            return 1;
        }
    }

    if (strlen (option) > 3 && option[1] == 'n' && option[2] == 'o')
        for (o=0;o<MAX_BOOLEAN_OPTIONS;o++)
        {
            if (strcmp (booleanOptionTags[o], &option[3]) == 0)
            {
                booleanOptions[o] = 0;
                return 1;
            }
        }
    return 0;
}